

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

pool_ptr<soul::heart::Function> __thiscall
soul::heart::Parser::findFunction(Parser *this,string *name,ArrayView<soul::Type> argTypes)

{
  string_view other;
  bool bVar1;
  __type_conflict1 _Var2;
  Module *pMVar3;
  pool_ref<soul::heart::Function> *ppVar4;
  Function *pFVar5;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *this_00;
  string *child;
  Parser *pPVar6;
  Type *in_R8;
  ArrayView<soul::Type> argTypes_00;
  ArrayView<soul::Type> argTypes_01;
  bool local_139;
  string local_f0;
  pool_ref *local_d0;
  pool_ref<soul::heart::Function> *fn_1;
  pool_ref<soul::heart::Function> *__end4;
  pool_ref<soul::heart::Function> *__begin4;
  ArrayView<soul::pool_ref<soul::heart::Function>_> *local_a8;
  ArrayView<soul::pool_ref<soul::heart::Function>_> *__range4;
  pool_ref<soul::Module> *m;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range3_1;
  pool_ref<soul::heart::Function> *fn;
  pool_ref<soul::heart::Function> *__end3;
  pool_ref<soul::heart::Function> *__begin3;
  ArrayView<soul::pool_ref<soul::heart::Function>_> *local_38;
  ArrayView<soul::pool_ref<soul::heart::Function>_> *__range3;
  string *name_local;
  Parser *this_local;
  ArrayView<soul::Type> argTypes_local;
  
  pPVar6 = (Parser *)argTypes.e;
  __range3 = (ArrayView<soul::pool_ref<soul::heart::Function>_> *)argTypes.s;
  name_local = name;
  this_local = pPVar6;
  argTypes_local.s = in_R8;
  argTypes_local.e = (Type *)this;
  bVar1 = containsChar((string *)__range3,':');
  if (bVar1) {
    this_00 = Program::getModules((Program *)((long)&name[3].field_2 + 8));
    __end3_1 = std::
               vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
               ::begin(this_00);
    m = (pool_ref<soul::Module> *)
        std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::
        end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                               *)&m), bVar1) {
      __range4 = (ArrayView<soul::pool_ref<soul::heart::Function>_> *)
                 __gnu_cxx::
                 __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                 ::operator*(&__end3_1);
      pMVar3 = pool_ref<soul::Module>::operator->((pool_ref<soul::Module> *)__range4);
      ___begin4 = Module::Functions::get(&pMVar3->functions);
      local_a8 = (ArrayView<soul::pool_ref<soul::heart::Function>_> *)&__begin4;
      __end4 = ArrayView<soul::pool_ref<soul::heart::Function>_>::begin(local_a8);
      fn_1 = ArrayView<soul::pool_ref<soul::heart::Function>_>::end(local_a8);
      for (; __end4 != fn_1; __end4 = __end4 + 1) {
        local_d0 = (pool_ref *)__end4;
        pMVar3 = pool_ref<soul::Module>::operator->((pool_ref<soul::Module> *)__range4);
        pFVar5 = pool_ref<soul::heart::Function>::operator->
                           ((pool_ref<soul::heart::Function> *)local_d0);
        child = Identifier::operator_cast_to_string_(&pFVar5->name);
        TokenisedPathString::join(&local_f0,&pMVar3->fullName,child);
        _Var2 = std::operator==(&local_f0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__range3);
        pPVar6 = (Parser *)CONCAT71((int7)((ulong)pPVar6 >> 8),_Var2);
        local_139 = false;
        if (_Var2) {
          pFVar5 = pool_ref::operator_cast_to_Function_(local_d0);
          argTypes_01.e = (Type *)pPVar6;
          argTypes_01.s = argTypes_local.s;
          local_139 = functionArgTypesMatch((Parser *)pFVar5,(Function *)this_local,argTypes_01);
        }
        std::__cxx11::string::~string((string *)&local_f0);
        if (local_139 != false) {
          pool_ref::operator_cast_to_pool_ptr((pool_ref *)this);
          return (pool_ptr<soul::heart::Function>)(Function *)this;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
      ::operator++(&__end3_1);
    }
  }
  else {
    pMVar3 = pool_ptr<soul::Module>::operator->((pool_ptr<soul::Module> *)&name[4]._M_string_length)
    ;
    ___begin3 = Module::Functions::get(&pMVar3->functions);
    local_38 = (ArrayView<soul::pool_ref<soul::heart::Function>_> *)&__begin3;
    __end3 = ArrayView<soul::pool_ref<soul::heart::Function>_>::begin(local_38);
    ppVar4 = ArrayView<soul::pool_ref<soul::heart::Function>_>::end(local_38);
    for (; __end3 != ppVar4; __end3 = __end3 + 1) {
      pFVar5 = pool_ref<soul::heart::Function>::operator->(__end3);
      other = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)__range3);
      bVar1 = Identifier::operator==(&pFVar5->name,other);
      if (bVar1) {
        pFVar5 = pool_ref::operator_cast_to_Function_((pool_ref *)__end3);
        argTypes_00.e = (Type *)pPVar6;
        argTypes_00.s = argTypes_local.s;
        bVar1 = functionArgTypesMatch((Parser *)pFVar5,(Function *)this_local,argTypes_00);
        if (bVar1) {
          pool_ref::operator_cast_to_pool_ptr((pool_ref *)this);
          return (pool_ptr<soul::heart::Function>)(Function *)this;
        }
      }
    }
  }
  pool_ptr<soul::heart::Function>::pool_ptr((pool_ptr<soul::heart::Function> *)this);
  return (pool_ptr<soul::heart::Function>)(Function *)this;
}

Assistant:

pool_ptr<heart::Function> findFunction (const std::string& name, ArrayView<Type> argTypes)
    {
        if (! containsChar (name, ':'))
        {
            for (auto& fn : module->functions.get())
                if (fn->name == name && functionArgTypesMatch (fn, argTypes))
                    return fn;
        }
        else
        {
            for (auto& m : program.getModules())
                for (auto& fn : m->functions.get())
                    if (TokenisedPathString::join (m->fullName, fn->name) == name && functionArgTypesMatch (fn, argTypes))
                        return fn;
        }

        return {};
    }